

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_cosine_transform.h
# Opt level: O0

void __thiscall sptk::DiscreteCosineTransform::Buffer::~Buffer(Buffer *this)

{
  Buffer *in_RDI;
  
  ~Buffer(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Buffer() {
    }